

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcolumn_bmod.c
# Opt level: O2

int zcolumn_bmod(int jcol,int nseg,doublecomplex *dense,doublecomplex *tempv,int *segrep,int *repfnz
                ,int fpanelc,GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  doublecomplex *pdVar1;
  undefined8 *puVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  doublecomplex dVar11;
  doublecomplex dVar12;
  doublecomplex dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  int iVar17;
  double dVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  double dVar22;
  int iVar23;
  int_t iVar24;
  long lVar25;
  doublecomplex *pdVar26;
  int *piVar27;
  int iVar28;
  double *pdVar29;
  long lVar30;
  double *pdVar31;
  uint ldm;
  int iVar32;
  uint nrow;
  uint uVar33;
  int iVar34;
  long lVar35;
  ulong uVar36;
  void *pvVar37;
  uint uVar38;
  int iVar39;
  int iVar40;
  uint uVar41;
  int *piVar42;
  long lVar43;
  long lVar44;
  int_t *piVar45;
  flops_t *pfVar46;
  doublecomplex *pdVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  doublecomplex zero;
  void *local_e8;
  int local_d4;
  doublecomplex *local_d0;
  int *local_c8;
  int *local_c0;
  long local_b8;
  int_t *local_b0;
  int_t *local_a8;
  int local_9c;
  int local_98;
  int local_94;
  long local_90;
  flops_t *local_88;
  int *local_80;
  long local_78;
  long local_70;
  long local_68;
  ulong local_60;
  long local_58;
  int *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0;
  uStack_40 = 0;
  pfVar46 = stat->ops;
  local_80 = Glu->xsup;
  piVar42 = Glu->supno;
  piVar45 = Glu->lsub;
  local_b0 = Glu->xlsub;
  local_e8 = Glu->lusup;
  local_a8 = Glu->xlusup;
  local_d4 = Glu->nzlumax;
  lVar44 = (long)nseg;
  local_94 = 0;
  if (0 < nseg) {
    local_94 = nseg;
  }
  local_90 = (long)jcol;
  local_78 = (long)piVar42[local_90];
  local_70 = (long)local_e8 + 0x18;
  local_58 = (long)local_e8 + 8;
  local_d0 = tempv;
  local_c8 = piVar42;
  local_c0 = segrep;
  local_9c = local_d4;
  local_98 = jcol;
  local_88 = pfVar46;
  local_50 = repfnz;
  for (iVar23 = 0; iVar23 != local_94; iVar23 = iVar23 + 1) {
    lVar44 = lVar44 + -1;
    iVar10 = segrep[lVar44];
    if ((int)local_78 != piVar42[iVar10]) {
      iVar40 = local_80[piVar42[iVar10]];
      iVar34 = fpanelc;
      if (fpanelc < iVar40) {
        iVar34 = iVar40;
      }
      iVar39 = iVar34 - iVar40;
      iVar28 = local_a8[iVar34] + iVar39;
      iVar32 = local_b0[iVar40];
      iVar17 = local_50[iVar10];
      if (local_50[iVar10] <= fpanelc) {
        iVar17 = fpanelc;
      }
      uVar41 = (iVar10 - iVar17) + 1;
      uVar38 = iVar10 - iVar34;
      lVar25 = (long)local_b0[(long)iVar40 + 1];
      ldm = local_b0[(long)iVar40 + 1] - iVar32;
      nrow = (~uVar38 - iVar39) + ldm;
      pfVar46[0x13] = (float)(int)((iVar10 - iVar17) * uVar41 * 4) + pfVar46[0x13];
      iVar32 = iVar32 + iVar39;
      iVar40 = uVar38 + iVar32 + 1;
      pfVar46[0x14] = (float)(int)(nrow * uVar41 * 8) + pfVar46[0x14];
      lVar43 = (long)(int)(iVar32 + uVar38);
      uVar33 = iVar10 - iVar17;
      segrep = local_c0;
      piVar42 = local_c8;
      local_b8 = lVar44;
      if (uVar33 == 0) {
        dVar15 = dense[piVar45[lVar43]].r;
        dVar16 = dense[piVar45[lVar43]].i;
        pdVar29 = (double *)((long)(int)(iVar28 + uVar38 + 1 + ldm * uVar38) * 0x10 + local_58);
        for (lVar43 = (long)iVar40; lVar43 < lVar25; lVar43 = lVar43 + 1) {
          iVar10 = piVar45[lVar43];
          dVar48 = pdVar29[-1];
          dVar49 = *pdVar29;
          dVar3 = dense[iVar10].i;
          dense[iVar10].r = dense[iVar10].r - (dVar48 * dVar15 + dVar49 * -dVar16);
          dense[iVar10].i = dVar3 - (dVar48 * dVar16 + dVar49 * dVar15);
          pdVar29 = pdVar29 + 2;
        }
      }
      else if ((int)uVar33 < 3) {
        iVar28 = (ldm + 1) * uVar38 + iVar28;
        iVar10 = piVar45[lVar43 + -1];
        dVar15 = dense[piVar45[lVar43]].r;
        dVar16 = dense[piVar45[lVar43]].i;
        dVar48 = dense[iVar10].r;
        dVar49 = dense[iVar10].i;
        iVar34 = iVar28 - ldm;
        if (uVar41 == 2) {
          lVar30 = (long)iVar34 * 0x10;
          dVar3 = *(double *)((long)local_e8 + lVar30 + 8);
          dVar15 = dVar15 - (*(double *)((long)local_e8 + lVar30) * dVar48 + dVar3 * -dVar49);
          dVar16 = dVar16 - (*(double *)((long)local_e8 + lVar30) * dVar49 + dVar3 * dVar48);
          dVar11.i._0_4_ = SUB84(dVar16,0);
          dVar11.r = dVar15;
          dVar11.i._4_4_ = (int)((ulong)dVar16 >> 0x20);
          dense[piVar45[lVar43]] = dVar11;
          lVar43 = (long)iVar28 * 0x10;
          pvVar37 = local_e8;
          for (lVar35 = (long)iVar40; lVar35 < lVar25; lVar35 = lVar35 + 1) {
            iVar10 = piVar45[lVar35];
            dVar3 = *(double *)((long)pvVar37 + lVar43 + 0x10);
            dVar4 = *(double *)((long)pvVar37 + lVar43 + 0x18);
            dVar5 = *(double *)((long)pvVar37 + lVar30 + 0x10);
            dVar6 = *(double *)((long)pvVar37 + lVar30 + 0x18);
            dVar18 = dense[iVar10].i;
            dense[iVar10].r =
                 dense[iVar10].r -
                 (dVar5 * dVar48 + dVar6 * -dVar49 + dVar3 * dVar15 + dVar4 * -dVar16);
            dense[iVar10].i =
                 dVar18 - (dVar5 * dVar49 + dVar6 * dVar48 + dVar3 * dVar16 + dVar4 * dVar15);
            pvVar37 = (void *)((long)pvVar37 + 0x10);
          }
        }
        else {
          lVar35 = (long)(int)(iVar34 - ldm) * 0x10;
          dVar6 = dense[piVar45[lVar43 + -2]].r;
          dVar18 = dense[piVar45[lVar43 + -2]].i;
          dVar50 = -dVar18;
          dVar3 = *(double *)((long)local_e8 + lVar35 + -0x10);
          dVar4 = *(double *)((long)local_e8 + lVar35 + -8);
          dVar5 = *(double *)((long)local_e8 + lVar35 + 8);
          dVar48 = dVar48 - (dVar3 * dVar6 + dVar4 * dVar50);
          dVar49 = dVar49 - (dVar3 * dVar18 + dVar4 * dVar6);
          lVar30 = (long)iVar34 * 0x10;
          dVar3 = *(double *)((long)local_e8 + lVar30 + 8);
          dVar15 = dVar15 - (*(double *)((long)local_e8 + lVar35) * dVar6 + dVar5 * dVar50 +
                            *(double *)((long)local_e8 + lVar30) * dVar48 + dVar3 * -dVar49);
          dVar16 = dVar16 - (*(double *)((long)local_e8 + lVar35) * dVar18 + dVar5 * dVar6 +
                            *(double *)((long)local_e8 + lVar30) * dVar49 + dVar3 * dVar48);
          dVar12.i._0_4_ = SUB84(dVar16,0);
          dVar12.r = dVar15;
          dVar12.i._4_4_ = (int)((ulong)dVar16 >> 0x20);
          dense[piVar45[lVar43]] = dVar12;
          dense[iVar10].r = dVar48;
          dense[iVar10].i = dVar49;
          pdVar29 = (double *)((long)iVar28 * 0x10 + local_70);
          pdVar31 = (double *)(lVar30 + local_70);
          for (lVar43 = (long)iVar40; lVar43 < lVar25; lVar43 = lVar43 + 1) {
            iVar10 = piVar45[lVar43];
            dVar3 = pdVar29[-1];
            dVar4 = *pdVar29;
            dVar5 = pdVar31[-1];
            dVar7 = *pdVar31;
            dVar8 = pdVar31[(long)(int)ldm * -2 + -1];
            dVar9 = pdVar31[(long)(int)ldm * -2];
            dVar22 = dense[iVar10].i;
            dense[iVar10].r =
                 dense[iVar10].r -
                 (dVar8 * dVar6 + dVar9 * dVar50 +
                 dVar5 * dVar48 + dVar7 * -dVar49 + dVar3 * dVar15 + dVar4 * -dVar16);
            dense[iVar10].i =
                 dVar22 - (dVar8 * dVar18 + dVar9 * dVar6 +
                          dVar5 * dVar49 + dVar7 * dVar48 + dVar3 * dVar16 + dVar4 * dVar15);
            pdVar29 = pdVar29 + 2;
            pdVar31 = pdVar31 + 2;
          }
        }
      }
      else {
        piVar42 = piVar45 + (iVar32 + (iVar17 - iVar34));
        pdVar26 = local_d0;
        for (uVar36 = 0; uVar36 <= uVar33; uVar36 = uVar36 + 1) {
          dVar15 = dense[piVar42[uVar36]].i;
          pdVar26->r = dense[piVar42[uVar36]].r;
          pdVar26->i = dVar15;
          pdVar26 = pdVar26 + 1;
        }
        local_68 = (long)(int)((ldm + 1) * (iVar17 - iVar34) + iVar28);
        local_60 = (ulong)ldm;
        zlsolve(ldm,uVar41,(doublecomplex *)(local_68 * 0x10 + (long)local_e8),local_d0);
        pdVar47 = local_d0 + uVar41;
        zmatvec((int)local_60,nrow,uVar41,
                (doublecomplex *)((long)(int)((int)local_68 + uVar41) * 0x10 + (long)local_e8),
                local_d0,pdVar47);
        piVar27 = piVar42;
        pdVar26 = local_d0;
        for (uVar36 = 0; uVar36 <= uVar33; uVar36 = uVar36 + 1) {
          uVar19 = *(undefined4 *)((long)&pdVar26->r + 4);
          uVar20 = *(undefined4 *)&pdVar26->i;
          uVar21 = *(undefined4 *)((long)&pdVar26->i + 4);
          pdVar1 = dense + piVar42[uVar36];
          *(undefined4 *)&pdVar1->r = *(undefined4 *)&pdVar26->r;
          *(undefined4 *)((long)&pdVar1->r + 4) = uVar19;
          *(undefined4 *)&pdVar1->i = uVar20;
          *(undefined4 *)((long)&pdVar1->i + 4) = uVar21;
          pdVar26->r = 0.0;
          pdVar26->i = 0.0;
          pdVar26 = pdVar26 + 1;
          piVar27 = piVar27 + 1;
        }
        if ((int)nrow < 1) {
          nrow = 0;
        }
        for (lVar25 = 0; segrep = local_c0, piVar42 = local_c8, lVar44 = local_b8,
            pfVar46 = local_88, (ulong)nrow * 0x10 != lVar25; lVar25 = lVar25 + 0x10) {
          pdVar29 = (double *)((long)&pdVar47->r + lVar25);
          dVar15 = dense[*piVar27].i - pdVar29[1];
          dVar13.i._0_4_ = SUB84(dVar15,0);
          dVar13.r = dense[*piVar27].r - *pdVar29;
          dVar13.i._4_4_ = (int)((ulong)dVar15 >> 0x20);
          dense[*piVar27] = dVar13;
          puVar2 = (undefined8 *)((long)&pdVar47->r + lVar25);
          *puVar2 = 0;
          puVar2[1] = 0;
          piVar27 = piVar27 + 1;
        }
      }
    }
  }
  iVar23 = local_a8[local_90];
  iVar10 = local_80[local_78];
  iVar40 = local_b0[(long)iVar10 + 1];
  iVar34 = local_b0[iVar10];
  iVar32 = local_9c;
  while( true ) {
    if ((iVar40 + iVar23) - iVar34 <= iVar32) {
      pdVar29 = (double *)((long)iVar23 * 0x10 + (long)local_e8);
      for (lVar44 = (long)local_b0[iVar10]; lVar44 < local_b0[(long)iVar10 + 1]; lVar44 = lVar44 + 1
          ) {
        iVar40 = piVar45[lVar44];
        dVar15 = dense[iVar40].i;
        *pdVar29 = dense[iVar40].r;
        pdVar29[1] = dVar15;
        dense[iVar40].r = 0.0;
        dense[iVar40].i = 0.0;
        iVar23 = iVar23 + 1;
        pdVar29 = pdVar29 + 2;
      }
      if (fpanelc < iVar10) {
        fpanelc = iVar10;
      }
      local_a8[local_90 + 1] = iVar23;
      iVar23 = (int)local_90;
      iVar40 = iVar23 - fpanelc;
      if (iVar40 != 0 && fpanelc <= iVar23) {
        iVar34 = local_a8[fpanelc];
        iVar32 = local_b0[(long)iVar10 + 1] - local_b0[iVar10];
        uVar41 = (iVar10 - iVar23) + iVar32;
        iVar23 = local_a8[local_90];
        local_88[0x13] = (float)((iVar40 + -1) * iVar40 * 4) + local_88[0x13];
        lVar44 = (long)iVar34 + (long)(fpanelc - iVar10);
        lVar25 = (long)iVar23 + (long)(fpanelc - iVar10);
        local_88[0x14] = (float)(int)(iVar40 * uVar41 * 8) + local_88[0x14];
        pdVar47 = (doublecomplex *)(lVar25 * 0x10 + (long)local_e8);
        zlsolve(iVar32,iVar40,(doublecomplex *)(lVar44 * 0x10 + (long)local_e8),pdVar47);
        pdVar26 = local_d0;
        zmatvec(iVar32,uVar41,iVar40,
                (doublecomplex *)((long)((int)lVar44 + iVar40) * 0x10 + (long)local_e8),pdVar47,
                local_d0);
        iVar40 = iVar40 + (int)lVar25;
        if ((int)uVar41 < 1) {
          uVar41 = 0;
        }
        for (lVar44 = 0; (ulong)uVar41 * 0x10 != lVar44; lVar44 = lVar44 + 0x10) {
          pdVar29 = (double *)((long)local_e8 + lVar44 + (long)iVar40 * 0x10);
          pdVar31 = (double *)((long)&pdVar26->r + lVar44);
          dVar15 = pdVar29[1] - pdVar31[1];
          auVar14._8_4_ = SUB84(dVar15,0);
          auVar14._0_8_ = *pdVar29 - *pdVar31;
          auVar14._12_4_ = (int)((ulong)dVar15 >> 0x20);
          *(undefined1 (*) [16])((long)local_e8 + lVar44 + (long)iVar40 * 0x10) = auVar14;
          puVar2 = (undefined8 *)((long)&pdVar26->r + lVar44);
          *puVar2 = local_48;
          puVar2[1] = uStack_40;
        }
      }
      return 0;
    }
    iVar24 = zLUMemXpand(local_98,iVar23,LUSUP,&local_d4,Glu);
    if (iVar24 != 0) break;
    piVar45 = Glu->lsub;
    local_e8 = Glu->lusup;
    iVar32 = local_d4;
  }
  return iVar24;
}

Assistant:

int
zcolumn_bmod (
	     const int  jcol,	  /* in */
	     const int  nseg,	  /* in */
	     doublecomplex     *dense,	  /* in */
	     doublecomplex     *tempv,	  /* working array */
	     int        *segrep,  /* in */
	     int        *repfnz,  /* in */
	     int        fpanelc,  /* in -- first column in the current panel */
	     GlobalLU_t *Glu,     /* modified */
	     SuperLUStat_t *stat  /* output */
	     )
{

#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int         incx = 1, incy = 1;
    doublecomplex      alpha, beta;
    
    /* krep = representative of current k-th supernode
     * fsupc = first supernodal column
     * nsupc = no of columns in supernode
     * nsupr = no of rows in supernode (used as leading dimension)
     * luptr = location of supernodal LU-block in storage
     * kfnz = first nonz in the k-th supernodal segment
     * no_zeros = no of leading zeros in a supernodal U-segment
     */
    doublecomplex      ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          fsupc, nsupc, nsupr, segsze;
    int          nrow;	  /* No of rows in the matrix of matrix-vector */
    int          jcolp1, jsupno, k, ksub, krep, krep_ind, ksupno;
    int_t        lptr, kfnz, isub, irow, i;
    int_t        no_zeros, new_next, ufirst, nextlu;
    int          fst_col; /* First column within small LU update */
    int          d_fsupc; /* Distance between the first column of the current
			     panel and the first column of the current snode. */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    doublecomplex       *lusup;
    int_t        *xlusup;
    int_t        nzlumax;
    doublecomplex       *tempv1;
    doublecomplex      zero = {0.0, 0.0};
    doublecomplex      one = {1.0, 0.0};
    doublecomplex      none = {-1.0, 0.0};
    doublecomplex	 comp_temp, comp_temp1;
    int_t        mem_error;
    flops_t      *ops = stat->ops;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (doublecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;
    nzlumax = Glu->nzlumax;
    jcolp1 = jcol + 1;
    jsupno = supno[jcol];
    
    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {

	krep = segrep[k];
	k--;
	ksupno = supno[krep];
	if ( jsupno != ksupno ) { /* Outside the rectangular supernode */

	    fsupc = xsup[ksupno];
	    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

  	    /* Distance from the current supernode to the current panel; 
	       d_fsupc=0 if fsupc > fpanelc. */
  	    d_fsupc = fst_col - fsupc; 

	    luptr = xlusup[fst_col] + d_fsupc;
	    lptr = xlsub[fsupc] + d_fsupc;

	    kfnz = repfnz[krep];
	    kfnz = SUPERLU_MAX ( kfnz, fpanelc );

	    segsze = krep - kfnz + 1;
	    nsupc = krep - fst_col + 1;
	    nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	    nrow = nsupr - d_fsupc - nsupc;
	    krep_ind = lptr + nsupc - 1;

	    ops[TRSV] += 4 * segsze * (segsze - 1);
	    ops[GEMV] += 8 * nrow * segsze;



	    /* 
	     * Case 1: Update U-segment of size 1 -- col-col update 
	     */
	    if ( segsze == 1 ) {
	  	ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc;

		for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    irow = lsub[i];
		    zz_mult(&comp_temp, &ukj, &lusup[luptr]);
		    z_sub(&dense[irow], &dense[irow], &comp_temp);
		    luptr++;
		}

	    } else if ( segsze <= 3 ) {
		ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc-1;
		ukj1 = dense[lsub[krep_ind - 1]];
		luptr1 = luptr - nsupr;

		if ( segsze == 2 ) { /* Case 2: 2cols-col update */
		    zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		    z_sub(&ukj, &ukj, &comp_temp);
		    dense[lsub[krep_ind]] = ukj;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
			zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			z_add(&comp_temp, &comp_temp, &comp_temp1);
			z_sub(&dense[irow], &dense[irow], &comp_temp);
		    }
		} else { /* Case 3: 3cols-col update */
		    ukj2 = dense[lsub[krep_ind - 2]];
		    luptr2 = luptr1 - nsupr;
  		    zz_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		    z_sub(&ukj1, &ukj1, &comp_temp);

		    zz_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		    zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		    z_add(&comp_temp, &comp_temp, &comp_temp1);
		    z_sub(&ukj, &ukj, &comp_temp);

		    dense[lsub[krep_ind]] = ukj;
		    dense[lsub[krep_ind-1]] = ukj1;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
			luptr2++;
			zz_mult(&comp_temp, &ukj, &lusup[luptr]);
			zz_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			z_add(&comp_temp, &comp_temp, &comp_temp1);
			zz_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			z_add(&comp_temp, &comp_temp, &comp_temp1);
			z_sub(&dense[irow], &dense[irow], &comp_temp);
		    }
		}


	    } else {
	  	/*
		 * Case: sup-col update
		 * Perform a triangular solve and block update,
		 * then scatter the result of sup-col update to dense
		 */

		no_zeros = kfnz - fst_col;

	        /* Copy U[*,j] segment from dense[*] to tempv[*] */
	        isub = lptr + no_zeros;
	        for (i = 0; i < segsze; i++) {
	  	    irow = lsub[isub];
		    tempv[i] = dense[irow];
		    ++isub; 
	        }

	        /* Dense triangular solve -- start effective triangle */
		luptr += nsupr * no_zeros + no_zeros; 
		
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#else		
		ztrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#endif		
 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
                alpha = one;
                beta = zero;
#ifdef _CRAY
		CGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		zgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		zlsolve ( nsupr, segsze, &lusup[luptr], tempv );

 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
		zmatvec (nsupr, nrow , segsze, &lusup[luptr], tempv, tempv1);
#endif
		
		
                /* Scatter tempv[] into SPA dense[] as a temporary storage */
                isub = lptr + no_zeros;
                for (i = 0; i < segsze; i++) {
                    irow = lsub[isub];
                    dense[irow] = tempv[i];
                    tempv[i] = zero;
                    ++isub;
                }

		/* Scatter tempv1[] into SPA dense[] */
		for (i = 0; i < nrow; i++) {
		    irow = lsub[isub];
		    z_sub(&dense[irow], &dense[irow], &tempv1[i]);
		    tempv1[i] = zero;
		    ++isub;
		}
	    }
	    
	} /* if jsupno ... */

    } /* for each segment... */

    /*
     *	Process the supernodal portion of L\U[*,j]
     */
    nextlu = xlusup[jcol];
    fsupc = xsup[jsupno];

    /* Copy the SPA dense into L\U[*,j] */
    new_next = nextlu + xlsub[fsupc+1] - xlsub[fsupc];
    while ( new_next > nzlumax ) {
	mem_error = zLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu);
	if (mem_error) return (mem_error);
	lusup = (doublecomplex *) Glu->lusup;
	lsub = Glu->lsub;
    }

    for (isub = xlsub[fsupc]; isub < xlsub[fsupc+1]; isub++) {
  	irow = lsub[isub];
	lusup[nextlu] = dense[irow];
        dense[irow] = zero;
	++nextlu;
    }

    xlusup[jcolp1] = nextlu;	/* Close L\U[*,jcol] */

    /* For more updates within the panel (also within the current supernode), 
     * should start from the first column of the panel, or the first column 
     * of the supernode, whichever is bigger. There are 2 cases:
     *    1) fsupc < fpanelc, then fst_col := fpanelc
     *    2) fsupc >= fpanelc, then fst_col := fsupc
     */
    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

    if ( fst_col < jcol ) {

  	/* Distance between the current supernode and the current panel.
	   d_fsupc=0 if fsupc >= fpanelc. */
  	d_fsupc = fst_col - fsupc;

	lptr = xlsub[fsupc] + d_fsupc;
	luptr = xlusup[fst_col] + d_fsupc;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	nsupc = jcol - fst_col;	/* Excluding jcol */
	nrow = nsupr - d_fsupc - nsupc;

	/* Points to the beginning of jcol in snode L\U(jsupno) */
	ufirst = xlusup[jcol] + d_fsupc;	

	ops[TRSV] += 4 * nsupc * (nsupc - 1);
	ops[GEMV] += 8 * nrow * nsupc;
	
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
	CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#else
	ztrsv_( "L", "N", "U", &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#endif
	
	alpha = none; beta = one; /* y := beta*y + alpha*A*x */

#ifdef _CRAY
	CGEMV( ftcs2, &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#else
	zgemv_( "N", &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#endif
#else
	zlsolve ( nsupr, nsupc, &lusup[luptr], &lusup[ufirst] );

	zmatvec ( nsupr, nrow, nsupc, &lusup[luptr+nsupc],
		&lusup[ufirst], tempv );
	
        /* Copy updates from tempv[*] into lusup[*] */
	isub = ufirst + nsupc;
	for (i = 0; i < nrow; i++) {
	    z_sub(&lusup[isub], &lusup[isub], &tempv[i]);
	    tempv[i] = zero;
	    ++isub;
	}

#endif
	
	
    } /* if fst_col < jcol ... */ 

    return 0;
}